

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobjectmanager.cpp
# Opt level: O3

PAL_ERROR __thiscall
CorUnix::CSharedMemoryObjectManager::RegisterObject
          (CSharedMemoryObjectManager *this,CPalThread *pthr,IPalObject *pobjToRegister,
          CAllowedObjectTypes *paot,DWORD dwRightsRequested,HANDLE *pHandle,
          IPalObject **ppobjRegistered)

{
  long lVar1;
  _LIST_ENTRY *p_Var2;
  int iVar3;
  PAL_ERROR PVar4;
  BOOL BVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SHMPTR shmptr;
  undefined8 *puVar7;
  LPVOID pvVar8;
  char *__format;
  CPalThread *pThread;
  _func_int **value;
  undefined8 uVar9;
  void *local_70;
  VOID *pvImmutableData;
  IPalObject *local_60;
  IPalObject *pobjExisting;
  long local_50;
  DWORD local_48;
  undefined4 local_44;
  CPalThread *local_40;
  int local_34;
  long lVar6;
  
  pobjExisting = (IPalObject *)paot;
  local_48 = dwRightsRequested;
  local_40 = pthr;
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","RegisterObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0xee);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (pobjToRegister == (IPalObject *)0x0) {
    fprintf(_stderr,"] %s %s:%d","RegisterObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0xef);
    fprintf(_stderr,"Expression: NULL != pobjToRegister\n");
  }
  if (pobjExisting == (IPalObject *)0x0) {
    fprintf(_stderr,"] %s %s:%d","RegisterObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0xf0);
    fprintf(_stderr,"Expression: NULL != paot\n");
  }
  if (pHandle == (HANDLE *)0x0) {
    fprintf(_stderr,"] %s %s:%d","RegisterObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0xf1);
    fprintf(_stderr,"Expression: NULL != pHandle\n");
  }
  if (ppobjRegistered == (IPalObject **)0x0) {
    fprintf(_stderr,"] %s %s:%d","RegisterObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0xf2);
    fprintf(_stderr,"Expression: NULL != ppobjRegistered\n");
  }
  if (PAL_InitializeChakraCoreCalled == false) goto LAB_001d64dd;
  iVar3 = (*pobjToRegister->_vptr_IPalObject[1])(pobjToRegister);
  lVar6 = CONCAT44(extraout_var,iVar3);
  if (lVar6 == 0) {
    fprintf(_stderr,"] %s %s:%d","RegisterObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x101);
    fprintf(_stderr,"Expression: NULL != poa\n");
  }
  lVar1 = *(long *)(lVar6 + 0x10);
  if (lVar1 == 0) {
    local_44 = 0;
  }
  else {
    local_44 = (undefined4)CONCAT71((int7)((ulong)lVar1 >> 8),*(int *)(lVar1 + 0x10) != 0);
  }
  iVar3 = (**pobjToRegister->_vptr_IPalObject)(pobjToRegister);
  local_50 = CONCAT44(extraout_var_00,iVar3);
  iVar3 = (*pobjToRegister->_vptr_IPalObject[9])(pobjToRegister);
  pvImmutableData = &this->m_csListLock;
  InternalEnterCriticalSection(local_40,(PCRITICAL_SECTION)pvImmutableData);
  if (iVar3 == 1) {
    SHMLock();
    if (*(int *)(lVar6 + 8) != 0) goto LAB_001d6155;
LAB_001d61ca:
    p_Var2 = (this->m_leAnonymousObjects).Blink;
    pobjToRegister[0x1d]._vptr_IPalObject = (_func_int **)&this->m_leAnonymousObjects;
    pobjToRegister[0x1e]._vptr_IPalObject = (_func_int **)p_Var2;
    p_Var2->Flink = (_LIST_ENTRY *)(pobjToRegister + 0x1d);
    (this->m_leAnonymousObjects).Blink = (_LIST_ENTRY *)(pobjToRegister + 0x1d);
LAB_001d61f7:
    if ((iVar3 != 1) || (*(int *)(local_50 + 0x18) == 0)) {
LAB_001d6374:
      pThread = local_40;
      PVar4 = (**(code **)(*(long *)this + 0x18))
                        (this,local_40,pobjToRegister,local_48,(undefined1)local_44,0,pHandle);
      if (PVar4 == 0) {
        *ppobjRegistered = pobjToRegister;
        pobjToRegister = (IPalObject *)0x0;
        PVar4 = 0;
      }
      goto LAB_001d6478;
    }
    PVar4 = (*pobjToRegister->_vptr_IPalObject[2])(pobjToRegister,&local_70);
    if (PVar4 == 0) {
      pvVar8 = SHMPtrToPtr((SHMPTR)pobjToRegister[0x20]._vptr_IPalObject);
      PVar4 = 0x54f;
      if (pvVar8 == (LPVOID)0x0) {
        __format = "Failure to map pshmobj->GetShmObjData()\n";
        uVar9 = 0x1b0;
      }
      else {
        pvVar8 = SHMPtrToPtr(*(SHMPTR *)((long)pvVar8 + 0x20));
        if (pvVar8 != (LPVOID)0x0) {
          memcpy(pvVar8,local_70,(ulong)*(uint *)(local_50 + 0x18));
          goto LAB_001d6374;
        }
        __format = "Failure to map psmod->shmObjImmutableData\n";
        uVar9 = 0x1a9;
      }
    }
    else {
      __format = "Failure to obtain object immutable data\n";
      uVar9 = 0x195;
    }
    fprintf(_stderr,"] %s %s:%d","RegisterObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,uVar9);
    fprintf(_stderr,__format);
    pThread = local_40;
LAB_001d647e:
    SHMRelease();
  }
  else {
    if (*(int *)(lVar6 + 8) == 0) goto LAB_001d61ca;
    fprintf(_stderr,"] %s %s:%d","RegisterObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x11f);
    fprintf(_stderr,"Expression: fShared\n");
LAB_001d6155:
    local_34 = iVar3;
    PVar4 = (**(code **)(*(long *)this + 0x10))(this,local_40,lVar6,pobjExisting,&local_60);
    pThread = local_40;
    if (PVar4 == 0x7b) {
      p_Var2 = (this->m_leNamedObjects).Blink;
      pobjToRegister[0x1d]._vptr_IPalObject = (_func_int **)&this->m_leNamedObjects;
      pobjToRegister[0x1e]._vptr_IPalObject = (_func_int **)p_Var2;
      p_Var2->Flink = (_LIST_ENTRY *)(pobjToRegister + 0x1d);
      (this->m_leNamedObjects).Blink = (_LIST_ENTRY *)(pobjToRegister + 0x1d);
      pvVar8 = SHMPtrToPtr((SHMPTR)pobjToRegister[0x20]._vptr_IPalObject);
      if (pvVar8 == (LPVOID)0x0) {
        uVar9 = 0x15e;
LAB_001d644b:
        fprintf(_stderr,"] %s %s:%d","RegisterObject",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
                ,uVar9);
        fprintf(_stderr,"Failure to map shared object data\n");
        PVar4 = 0x54f;
        pThread = local_40;
        iVar3 = local_34;
      }
      else {
        shmptr = SHMGetInfo(SIID_NAMED_OBJECTS);
        if (shmptr == 0) {
          value = pobjToRegister[0x20]._vptr_IPalObject;
        }
        else {
          puVar7 = (undefined8 *)SHMPtrToPtr(shmptr);
          if (puVar7 == (undefined8 *)0x0) {
            uVar9 = 0x170;
            goto LAB_001d644b;
          }
          *(SHMPTR *)((long)pvVar8 + 8) = shmptr;
          value = pobjToRegister[0x20]._vptr_IPalObject;
          *puVar7 = value;
        }
        *(undefined4 *)((long)pvVar8 + 0x10) = 1;
        BVar5 = SHMSetInfo(SIID_NAMED_OBJECTS,(SHMPTR)value);
        iVar3 = local_34;
        if (BVar5 != 0) goto LAB_001d61f7;
        fprintf(_stderr,"] %s %s:%d","RegisterObject",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
                ,0x17a);
        fprintf(_stderr,"Failed to set shared named object list head\n");
        PVar4 = 0x54f;
        pThread = local_40;
      }
    }
    else {
      iVar3 = local_34;
      if (PVar4 == 0) {
        PVar4 = (**(code **)(*(long *)this + 0x18))
                          (this,local_40,local_60,local_48,(undefined1)local_44,0,pHandle);
        if (PVar4 == 0) {
          *ppobjRegistered = local_60;
          PVar4 = 0xb7;
          iVar3 = local_34;
        }
        else {
          (*local_60->_vptr_IPalObject[8])(local_60,pThread);
          iVar3 = local_34;
        }
      }
    }
LAB_001d6478:
    if (iVar3 == 1) goto LAB_001d647e;
  }
  InternalLeaveCriticalSection(pThread,(PCRITICAL_SECTION)pvImmutableData);
  if (pobjToRegister != (IPalObject *)0x0) {
    (*pobjToRegister->_vptr_IPalObject[8])(pobjToRegister,pThread);
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    return PVar4;
  }
LAB_001d64dd:
  abort();
}

Assistant:

PAL_ERROR
CSharedMemoryObjectManager::RegisterObject(
    CPalThread *pthr,
    IPalObject *pobjToRegister,
    CAllowedObjectTypes *paot,
    DWORD dwRightsRequested,
    HANDLE *pHandle,                 // OUT
    IPalObject **ppobjRegistered     // OUT
    )
{
    PAL_ERROR palError = NO_ERROR;
    CSharedMemoryObject *pshmobj = static_cast<CSharedMemoryObject*>(pobjToRegister);
    SHMObjData *psmodNew = NULL;
    CObjectAttributes *poa;
    CObjectType *potObj;
    IPalObject *pobjExisting;
    BOOL fInherit = FALSE;
    BOOL fShared = FALSE;

    _ASSERTE(NULL != pthr);
    _ASSERTE(NULL != pobjToRegister);
    _ASSERTE(NULL != paot);
    _ASSERTE(NULL != pHandle);
    _ASSERTE(NULL != ppobjRegistered);

    ENTRY("CSharedMemoryObjectManager::RegisterObject "
        "(this=%p, pthr=%p, pobjToRegister=%p, paot=%p, "
        "dwRightsRequested=%d, pHandle=%p, ppobjRegistered=%p)\n",
        this,
        pthr,
        pobjToRegister,
        paot,
        dwRightsRequested,
        pHandle,
        ppobjRegistered
        );

    poa = pobjToRegister->GetObjectAttributes();
    _ASSERTE(NULL != poa);

    if (NULL != poa->pSecurityAttributes)
    {
        fInherit = poa->pSecurityAttributes->bInheritHandle;
    }

    potObj = pobjToRegister->GetObjectType();
    fShared = (SharedObject == pshmobj->GetObjectDomain());
    
    InternalEnterCriticalSection(pthr, &m_csListLock);

    if (fShared)
    {
        //
        // We only need to acquire the shared memory lock if this
        // object is actually shared.
        //
        
        SHMLock();
    }

    if (0 != poa->sObjectName.GetStringLength())
    {
        SHMPTR shmObjectListHead = SHMNULL;

        //
        // The object must be shared
        //

        _ASSERTE(fShared);
        
        //
        // Check if an object by this name already exists
        //

        palError = LocateObject(
            pthr,
            &poa->sObjectName,
            paot,
            &pobjExisting
            );

        if (NO_ERROR == palError)
        {
            //
            // Obtain a new handle to the existing object
            //

            palError = ObtainHandleForObject(
                pthr,
                pobjExisting,
                dwRightsRequested,
                fInherit,
                NULL, 
                pHandle
                );

            if (NO_ERROR == palError)
            {
                //
                // Transfer object reference to out param
                //

                *ppobjRegistered = pobjExisting;
                palError = ERROR_ALREADY_EXISTS;
            }
            else
            {
                pobjExisting->ReleaseReference(pthr);
            }

            goto RegisterObjectExit;
        }
        else if (ERROR_INVALID_NAME != palError)
        {
            //
            // Something different than an object not found error
            // occurred. This is most likely due to a type conflict.
            //

            goto RegisterObjectExit;
        }

        //
        // Insert the object on the named object lists
        //

        InsertTailList(&m_leNamedObjects, pshmobj->GetObjectListLink());

        psmodNew = SHMPTR_TO_TYPED_PTR(SHMObjData, pshmobj->GetShmObjData());
        if (NULL == psmodNew)
        {
            ASSERT("Failure to map shared object data\n");
            palError = ERROR_INTERNAL_ERROR;
            goto RegisterObjectExit;
        }

        shmObjectListHead = SHMGetInfo(SIID_NAMED_OBJECTS);
        if (SHMNULL != shmObjectListHead)
        {
            SHMObjData *psmodListHead;
            
            psmodListHead = SHMPTR_TO_TYPED_PTR(SHMObjData, shmObjectListHead);
            if (NULL != psmodListHead)
            {
                psmodNew->shmNextObj = shmObjectListHead;
                psmodListHead->shmPrevObj = pshmobj->GetShmObjData();
            }
            else
            {
                ASSERT("Failure to map shared object data\n");
                palError = ERROR_INTERNAL_ERROR;
                goto RegisterObjectExit;
            }
        }

        psmodNew->fAddedToList = TRUE;

        if (!SHMSetInfo(SIID_NAMED_OBJECTS, pshmobj->GetShmObjData()))
        {
            ASSERT("Failed to set shared named object list head\n");
            palError = ERROR_INTERNAL_ERROR;
            goto RegisterObjectExit;
        }
    }
    else
    {
        //
        // Place the object on the anonymous object list
        //

        InsertTailList(&m_leAnonymousObjects, pshmobj->GetObjectListLink());
    }

    //
    // Hoist the object's immutable data (if any) into shared memory if
    // the object is shared
    //

    if (fShared && 0 != potObj->GetImmutableDataSize())
    {
        VOID *pvImmutableData;
        SHMObjData *psmod;

        palError = pobjToRegister->GetImmutableData(&pvImmutableData);
        if (NO_ERROR != palError)
        {
            ASSERT("Failure to obtain object immutable data\n");
            goto RegisterObjectExit;
        }

        psmod = SHMPTR_TO_TYPED_PTR(SHMObjData, pshmobj->GetShmObjData());
        if (NULL != psmod)
        {
            VOID *pvSharedImmutableData =
                SHMPTR_TO_TYPED_PTR(VOID, psmod->shmObjImmutableData);
            
            if (NULL != pvSharedImmutableData)
            {
                CopyMemory(
                    pvSharedImmutableData,
                    pvImmutableData,
                    potObj->GetImmutableDataSize()
                    );
            }
            else
            {
                ASSERT("Failure to map psmod->shmObjImmutableData\n");
                palError = ERROR_INTERNAL_ERROR;
                goto RegisterObjectExit;
            }
        }
        else
        {
            ASSERT("Failure to map pshmobj->GetShmObjData()\n");
            palError = ERROR_INTERNAL_ERROR;
            goto RegisterObjectExit;
        }
    }

    //
    // Obtain a handle for the new object
    //

    palError = ObtainHandleForObject(
        pthr,
        pobjToRegister,
        dwRightsRequested,
        fInherit,
        NULL, 
        pHandle
        );

    if (NO_ERROR == palError)
    {
        //
        // Transfer pobjToRegister reference to out param
        //

        *ppobjRegistered = pobjToRegister;
        pobjToRegister = NULL;
    }
        
RegisterObjectExit:

    if (fShared)
    {
        SHMRelease();
    }
    
    InternalLeaveCriticalSection(pthr, &m_csListLock);

    if (NULL != pobjToRegister)
    {
        pobjToRegister->ReleaseReference(pthr);
    }

    LOGEXIT("CSharedMemoryObjectManager::RegisterObject return %d\n", palError);

    return palError;
}